

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O3

void decompress_view(view_t *views,picnic_instance_t *pp,uint8_t *src,uint idx)

{
  ushort uVar1;
  sbyte sVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint64_t *f;
  byte *pbVar14;
  uint uVar15;
  word *pwVar16;
  
  bVar5 = (pp->lowmc).m;
  uVar15 = (uint)(pp->lowmc).r;
  if ((ulong)bVar5 == 10) {
    if (uVar15 != 0) {
      bVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      do {
        pbVar14 = src + (uVar7 >> 3) + 1;
        bVar4 = 8 - ((byte)uVar7 & 6);
        uVar10 = (bVar5 & 3) * -2 - 0xe;
        uVar9 = (ulong)((bVar5 & 3) * 2) + 0x16;
        sVar2 = (bVar4 < 0x21) * (' ' - bVar4);
        uVar3 = (ulong)(((uint)pbVar14[-1] << sVar2) >> sVar2);
        do {
          bVar4 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          uVar10 = uVar10 + 8;
          uVar9 = uVar9 - 8;
          uVar3 = (ulong)bVar4 | uVar3 << 8;
        } while (7 < (uint)uVar9);
        if ((uint)uVar9 != 0) {
          sVar2 = ((byte)uVar9 < 0x21) * (' ' - (byte)uVar9);
          uVar3 = (ulong)(((uint)(*pbVar14 >> (uVar10 & 0x1f)) << sVar2) >> sVar2) |
                  uVar3 << (uVar9 & 0x3f);
        }
        uVar7 = uVar7 + 0x1e;
        uVar6 = uVar6 + 1;
        bVar5 = bVar5 + 3;
        views->t[idx] = uVar3 << 0x22;
        views = views + 1;
      } while (uVar6 != uVar15);
    }
  }
  else if (uVar15 != 0) {
    uVar6 = 0;
    uVar3 = 0;
    uVar7 = (ulong)bVar5 * 3;
    uVar1 = (pp->lowmc).n;
    do {
      pwVar16 = views->s[idx].w64 + ((ulong)(uVar1 + 0x3f >> 6) - 1);
      uVar9 = uVar7;
      if (0x15 < bVar5) {
        uVar10 = (uint)uVar3 & 7;
        do {
          pbVar14 = src + (uVar3 >> 3) + 1;
          uVar8 = (ulong)((uint)pbVar14[-1] & ~(-1 << ((byte)(8 - (char)uVar10) & 0x1f)));
          uVar13 = (ulong)uVar10 | 0x38;
          uVar11 = -uVar10 - 0x30;
          do {
            bVar4 = *pbVar14;
            pbVar14 = pbVar14 + 1;
            uVar11 = uVar11 + 8;
            uVar13 = uVar13 - 8;
            uVar8 = (ulong)bVar4 | uVar8 << 8;
          } while (7 < (uint)uVar13);
          if ((uint)uVar13 != 0) {
            sVar2 = ((byte)uVar13 < 0x21) * (' ' - (byte)uVar13);
            uVar8 = (ulong)(((uint)(*pbVar14 >> (uVar11 & 0x1f)) << sVar2) >> sVar2) |
                    uVar8 << (uVar13 & 0x3f);
          }
          *pwVar16 = uVar8;
          uVar3 = uVar3 + 0x40;
          uVar9 = uVar9 - 0x40;
          pwVar16 = pwVar16 + -1;
        } while (0x3f < uVar9);
      }
      if (uVar9 == 0) goto LAB_0011b225;
      uVar10 = 8 - ((uint)uVar3 & 7);
      sVar2 = ((byte)uVar10 < 0x21) * (' ' - (byte)uVar10);
      uVar12 = ((uint)src[uVar3 >> 3] << sVar2) >> sVar2;
      uVar13 = (ulong)uVar12;
      uVar11 = (uint)uVar9;
      if (uVar10 < uVar11) {
        pbVar14 = src + (uVar3 >> 3);
        uVar11 = uVar11 - uVar10;
        while( true ) {
          pbVar14 = pbVar14 + 1;
          if (uVar11 < 8) break;
          uVar11 = uVar11 - 8;
          uVar13 = uVar13 << 8 | (ulong)*pbVar14;
        }
        if (uVar11 != 0) {
          bVar4 = (byte)uVar11;
          sVar2 = (bVar4 < 0x21) * (' ' - bVar4);
          uVar13 = (ulong)(((uint)(*pbVar14 >> ((byte)(8 - bVar4) & 0x1f)) << sVar2) >> sVar2) |
                   uVar13 << ((ulong)uVar11 & 0x3f);
        }
      }
      else {
        uVar13 = (ulong)(uVar12 >> ((ulong)(uVar10 - uVar11) & 0x3f));
      }
      uVar3 = uVar3 + uVar9;
      *pwVar16 = uVar13 << ((ulong)(byte)-(char)uVar9 & 0x3f);
      while( true ) {
        pwVar16 = pwVar16 + -1;
LAB_0011b225:
        if (pwVar16 < views->s + idx) break;
        *pwVar16 = 0;
      }
      uVar6 = uVar6 + 1;
      views = views + 1;
    } while (uVar6 != uVar15);
  }
  return;
}

Assistant:

static void decompress_view(view_t* views, const picnic_instance_t* pp, const uint8_t* src,
                            const unsigned int idx) {
  const unsigned int num_views = pp->lowmc.r;

  bitstream_t bs;
  bs.buffer.r = src;
  bs.position = 0;

  view_t* v = &views[0];
#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_192_192_4) || defined(WITH_LOWMC_255_255_4)
  if (pp->lowmc.m != 10) {
    const unsigned int view_round_size = pp->lowmc.m * 3;
    const unsigned int width           = (pp->lowmc.n + 63) / 64;

    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      mzd_from_bitstream(&bs, &v->s[idx], width, view_round_size);
    }
    return;
  }
#endif
  // clang-format off
#if defined(WITH_LOWMC_128_128_20) || defined(WITH_LOWMC_192_192_30) || defined(WITH_LOWMC_256_256_38)
  // clang-format on
  if (pp->lowmc.m == 10) {
    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      v->t[idx] = uint64_from_bitstream_10(&bs);
    }
    return;
  }
#endif
  UNREACHABLE;
}